

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::matrix3d> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::matrix3d>
          (optional<tinyusdz::value::matrix3d> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  long lVar2;
  storage_t<tinyusdz::value::matrix3d> *psVar3;
  storage_t<tinyusdz::value::matrix3d> *psVar4;
  byte bVar5;
  optional<tinyusdz::value::matrix3d> local_68;
  
  bVar5 = 0;
  bVar1 = is_blocked(this);
  if ((bVar1) || (bVar1 = has_value(this), !bVar1)) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
  }
  else {
    tinyusdz::value::Value::get_value<tinyusdz::value::matrix3d>(&local_68,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_68.has_value_;
    if (local_68.has_value_ == true) {
      psVar3 = &local_68.contained;
      psVar4 = &__return_storage_ptr__->contained;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)psVar4 = *(undefined8 *)psVar3;
        psVar3 = (storage_t<tinyusdz::value::matrix3d> *)
                 ((long)psVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        psVar4 = (storage_t<tinyusdz::value::matrix3d> *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }